

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

double __thiscall
CBlockPolicyEstimator::estimateConservativeFee
          (CBlockPolicyEstimator *this,uint doubleTarget,EstimationResult *result)

{
  uint uVar1;
  void *in_RDX;
  uint in_ESI;
  long in_FS_OFFSET;
  double dVar2;
  double longEstimate;
  double estimate;
  EstimationResult tempResult;
  EstimationResult *in_stack_000000d8;
  uint in_stack_000000e4;
  double in_stack_000000e8;
  double in_stack_000000f0;
  TxConfirmStats *in_stack_000000f8;
  int in_stack_000001dc;
  TxConfirmStats *in_stack_ffffffffffffff38;
  double local_98;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = -1.0;
  EstimationResult::EstimationResult((EstimationResult *)in_stack_ffffffffffffff38);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_ffffffffffffff38);
  uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff38);
  if (in_ESI <= uVar1) {
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_ffffffffffffff38);
    local_98 = TxConfirmStats::EstimateMedianVal
                         (in_stack_000000f8,in_stack_000001dc,in_stack_000000f0,in_stack_000000e8,
                          in_stack_000000e4,in_stack_000000d8);
  }
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_ffffffffffffff38);
  uVar1 = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff38);
  if (in_ESI <= uVar1) {
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_ffffffffffffff38);
    dVar2 = TxConfirmStats::EstimateMedianVal
                      (in_stack_000000f8,in_stack_000001dc,in_stack_000000f0,in_stack_000000e8,
                       in_stack_000000e4,in_stack_000000d8);
    if ((local_98 < dVar2) && (local_98 = dVar2, in_RDX != (void *)0x0)) {
      memcpy(in_RDX,local_78,0x6c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_98;
}

Assistant:

double CBlockPolicyEstimator::estimateConservativeFee(unsigned int doubleTarget, EstimationResult *result) const
{
    double estimate = -1;
    EstimationResult tempResult;
    if (doubleTarget <= shortStats->GetMaxConfirms()) {
        estimate = feeStats->EstimateMedianVal(doubleTarget, SUFFICIENT_FEETXS, DOUBLE_SUCCESS_PCT, nBestSeenHeight, result);
    }
    if (doubleTarget <= feeStats->GetMaxConfirms()) {
        double longEstimate = longStats->EstimateMedianVal(doubleTarget, SUFFICIENT_FEETXS, DOUBLE_SUCCESS_PCT, nBestSeenHeight, &tempResult);
        if (longEstimate > estimate) {
            estimate = longEstimate;
            if (result) *result = tempResult;
        }
    }
    return estimate;
}